

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ParseTokenize(void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  int iVar1;
  long lVar2;
  void *__s;
  size_t sVar3;
  int *pRc;
  char *pcVar4;
  int in_ECX;
  void *in_RDX;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int nNew;
  Fts5ExprPhrase *pNew;
  Fts5ExprTerm *pTerm;
  sqlite3_int64 nByte;
  Fts5ExprTerm *pSyn;
  Fts5ExprPhrase *pPhrase;
  TokenCtx *pCtx;
  int SZALLOC;
  int rc;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_70;
  int in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  char *local_48;
  int local_2c;
  int local_10;
  int local_c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  local_48 = (char *)*in_RDI;
  if ((int)in_RDI[2] == 0) {
    local_2c = in_ECX;
    if (0x8000 < in_ECX) {
      local_2c = 0x8000;
    }
    if (((local_48 == (char *)0x0) || (*(int *)(local_48 + 0x18) < 1)) || ((in_ESI & 1) == 0)) {
      if ((local_48 == (char *)0x0) || (*(int *)(local_48 + 0x18) % 8 == 0)) {
        if (local_48 == (char *)0x0) {
          local_70 = 0;
        }
        else {
          local_70 = *(int *)(local_48 + 0x18);
        }
        in_stack_ffffffffffffff94 = local_70 + 8;
        in_stack_ffffffffffffff98 =
             (char *)sqlite3_realloc64((void *)CONCAT44(in_stack_ffffffffffffff8c,
                                                        in_stack_ffffffffffffff88),0x274cb7);
        if (in_stack_ffffffffffffff98 == (char *)0x0) {
          local_c = 7;
        }
        else {
          if (local_48 == (char *)0x0) {
            memset(in_stack_ffffffffffffff98,0,0x48);
          }
          *in_RDI = (long)in_stack_ffffffffffffff98;
          *(int *)(in_stack_ffffffffffffff98 + 0x18) = in_stack_ffffffffffffff94 + -8;
          local_48 = in_stack_ffffffffffffff98;
        }
      }
      if (local_c == 0) {
        iVar1 = *(int *)(local_48 + 0x18);
        *(int *)(local_48 + 0x18) = iVar1 + 1;
        pRc = (int *)(local_48 + (long)iVar1 * 0x28 + 0x20);
        memset(pRc,0,0x28);
        pcVar4 = sqlite3Fts5Strndup(pRc,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
        *(char **)(pRc + 2) = pcVar4;
        pRc[4] = local_2c;
        pRc[5] = local_2c;
        if (*(int *)(in_RDI[1] + 0x6c) != 0) {
          sVar3 = strlen(*(char **)(pRc + 2));
          pRc[4] = (int)sVar3;
        }
      }
    }
    else {
      __s = sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (__s == (void *)0x0) {
        local_c = 7;
      }
      else {
        memset(__s,0,(long)local_2c + 0x39);
        *(long *)((long)__s + 8) = (long)__s + 0x38;
        *(int *)((long)__s + 0x10) = local_2c;
        *(int *)((long)__s + 0x14) = local_2c;
        if (*(int *)(in_RDI[1] + 0x6c) != 0) {
          sVar3 = strlen(*(char **)((long)__s + 8));
          *(int *)((long)__s + 0x10) = (int)sVar3;
        }
        memcpy(*(void **)((long)__s + 8),in_RDX,(long)local_2c);
        *(undefined8 *)((long)__s + 0x20) =
             *(undefined8 *)(local_48 + (long)(*(int *)(local_48 + 0x18) + -1) * 0x28 + 0x40);
        *(void **)(local_48 + (long)(*(int *)(local_48 + 0x18) + -1) * 0x28 + 0x40) = __s;
      }
    }
    *(int *)(in_RDI + 2) = local_c;
    local_10 = local_c;
  }
  else {
    local_10 = (int)in_RDI[2];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5ParseTokenize(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  int rc = SQLITE_OK;
  const int SZALLOC = 8;
  TokenCtx *pCtx = (TokenCtx*)pContext;
  Fts5ExprPhrase *pPhrase = pCtx->pPhrase;

  UNUSED_PARAM2(iUnused1, iUnused2);

  /* If an error has already occurred, this is a no-op */
  if( pCtx->rc!=SQLITE_OK ) return pCtx->rc;
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( pPhrase && pPhrase->nTerm>0 && (tflags & FTS5_TOKEN_COLOCATED) ){
    Fts5ExprTerm *pSyn;
    sqlite3_int64 nByte = sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer) + nToken+1;
    pSyn = (Fts5ExprTerm*)sqlite3_malloc64(nByte);
    if( pSyn==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pSyn, 0, (size_t)nByte);
      pSyn->pTerm = ((char*)pSyn) + sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer);
      pSyn->nFullTerm = pSyn->nQueryTerm = nToken;
      if( pCtx->pConfig->bTokendata ){
        pSyn->nQueryTerm = (int)strlen(pSyn->pTerm);
      }
      memcpy(pSyn->pTerm, pToken, nToken);
      pSyn->pSynonym = pPhrase->aTerm[pPhrase->nTerm-1].pSynonym;
      pPhrase->aTerm[pPhrase->nTerm-1].pSynonym = pSyn;
    }
  }else{
    Fts5ExprTerm *pTerm;
    if( pPhrase==0 || (pPhrase->nTerm % SZALLOC)==0 ){
      Fts5ExprPhrase *pNew;
      int nNew = SZALLOC + (pPhrase ? pPhrase->nTerm : 0);

      pNew = (Fts5ExprPhrase*)sqlite3_realloc64(pPhrase,
          sizeof(Fts5ExprPhrase) + sizeof(Fts5ExprTerm) * nNew
      );
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        if( pPhrase==0 ) memset(pNew, 0, sizeof(Fts5ExprPhrase));
        pCtx->pPhrase = pPhrase = pNew;
        pNew->nTerm = nNew - SZALLOC;
      }
    }

    if( rc==SQLITE_OK ){
      pTerm = &pPhrase->aTerm[pPhrase->nTerm++];
      memset(pTerm, 0, sizeof(Fts5ExprTerm));
      pTerm->pTerm = sqlite3Fts5Strndup(&rc, pToken, nToken);
      pTerm->nFullTerm = pTerm->nQueryTerm = nToken;
      if( pCtx->pConfig->bTokendata && rc==SQLITE_OK ){
        pTerm->nQueryTerm = (int)strlen(pTerm->pTerm);
      }
    }
  }

  pCtx->rc = rc;
  return rc;
}